

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::ComputeFlagsForObject_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *gtgt)

{
  cmMakefile *this_00;
  char *pcVar1;
  allocator local_c9;
  string includeFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_88;
  string language;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cmSourceFile::GetLanguage_abi_cxx11_(&language,source);
  if (language._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&language);
  }
  this_00 = lg->Makefile;
  std::__cxx11::string::string((string *)&includeFlags,"CMAKE_BUILD_TYPE",(allocator *)&local_88);
  pcVar1 = cmMakefile::GetSafeDefinition(this_00,&includeFlags);
  std::__cxx11::string::string((string *)&local_48,pcVar1,(allocator *)&includes);
  std::__cxx11::string::~string((string *)&includeFlags);
  cmLocalGenerator::GetTargetCompileFlags(lg,gtgt,&local_48,&language,__return_storage_ptr__);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalGenerator::GetIncludeDirectories(lg,&includes,gtgt,&language,&local_48,true);
  std::__cxx11::string::string((string *)&local_88,"",&local_c9);
  cmLocalGenerator::GetIncludeFlags(&includeFlags,lg,&includes,gtgt,&language,true,false,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  (*lg->_vptr_cmLocalGenerator[6])(lg,__return_storage_ptr__,&includeFlags);
  std::__cxx11::string::~string((string *)&includeFlags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  std::__cxx11::string::string((string *)&includeFlags,"COMPILE_FLAGS",(allocator *)&local_88);
  pcVar1 = cmSourceFile::GetProperty(source,&includeFlags);
  std::__cxx11::string::~string((string *)&includeFlags);
  if (pcVar1 != (char *)0x0) {
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&local_88);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)&includeFlags,(cmListFileBacktrace *)&local_88);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_88);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&includes,(char *)&includeFlags);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    pcVar1 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        includes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,lg,&local_48,false,
                        (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&includes);
    (*lg->_vptr_cmLocalGenerator[7])(lg,__return_storage_ptr__,pcVar1);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&includeFlags);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&language);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeFlagsForObject(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* gtgt)
{
  std::string flags;
  std::string language = source->GetLanguage();
  if (language.empty()) {
    language = "C";
  }
  std::string const& config =
    lg->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  lg->GetTargetCompileFlags(gtgt, config, language, flags);

  // Add include directory flags.
  {
    std::vector<std::string> includes;
    lg->GetIncludeDirectories(includes, gtgt, language, config);
    std::string includeFlags = lg->GetIncludeFlags(includes, gtgt, language,
                                                   true); // full include paths
    lg->AppendFlags(flags, includeFlags);
  }

  // Add source file specific flags.
  if (const char* cflags = source->GetProperty("COMPILE_FLAGS")) {
    cmGeneratorExpression ge;
    const char* processed = ge.Parse(cflags)->Evaluate(lg, config);
    lg->AppendFlags(flags, processed);
  }

  return flags;
}